

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O2

EStatusCode __thiscall
CFFEmbeddedFontWriter::WriteTopDictSegment
          (CFFEmbeddedFontWriter *this,MyStringBuf *ioTopDictSegment)

{
  _Rb_tree_header *p_Var1;
  undefined2 inOperator;
  TopDictInfo *this_00;
  EStatusCode EVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  LongFilePositionType LVar6;
  CFFPrimitiveWriter dictPrimitiveWriter;
  OutputStringBufferStream topDictStream;
  string local_1d8 [32];
  stringstream formatter;
  ostream local_1a8 [376];
  
  OutputStringBufferStream::OutputStringBufferStream(&topDictStream,ioTopDictSegment);
  CFFPrimitiveWriter::CFFPrimitiveWriter(&dictPrimitiveWriter,(IByteWriter *)0x0);
  CFFPrimitiveWriter::SetStream(&dictPrimitiveWriter,(IByteWriter *)&topDictStream);
  this_00 = (this->mOpenTypeInput).mCFF.mTopDictIndex;
  iVar3 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
          ::find((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                  *)this_00,&scROS);
  if (this->mIsCID == true) {
    CFFPrimitiveWriter::WriteDictItems
              (&dictPrimitiveWriter,(short)iVar3._M_node[1]._M_color,
               (DictOperandList *)&iVar3._M_node[1]._M_parent);
  }
  p_Var1 = &(this_00->mTopDict)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this_00->mTopDict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    inOperator = (undefined2)p_Var4[1]._M_color;
    if ((3 < (ushort)inOperator - 0xf) &&
       ((7 < (ushort)inOperator - 0xc1e || ((0xc1U >> ((ushort)inOperator - 0xc1e & 0x1f) & 1) == 0)
        ))) {
      CFFPrimitiveWriter::WriteDictItems
                (&dictPrimitiveWriter,inOperator,(DictOperandList *)&p_Var4[1]._M_parent);
    }
  }
  iVar3 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
          ::find((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                  *)this_00,&scEmbeddedPostscript);
  if (((_Rb_tree_header *)iVar3._M_node == p_Var1) && ((this->mOpenTypeInput).mOS2Exists == true)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&formatter);
    poVar5 = std::operator<<(local_1a8,"/FSType ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->mOpenTypeInput).mOS2.fsType);
    std::operator<<(poVar5," def");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->mOptionalEmbeddedPostscript,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    CFFPrimitiveWriter::WriteIntegerOperand
              (&dictPrimitiveWriter,(ulong)(this->mOpenTypeInput).mCFF.mStringsCount + 0x187);
    CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0xc15);
    std::__cxx11::stringstream::~stringstream((stringstream *)&formatter);
  }
  else {
    std::__cxx11::string::assign((char *)&this->mOptionalEmbeddedPostscript);
  }
  LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
  this->mCharsetPlaceHolderPosition = LVar6;
  CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
  CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0xf);
  LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
  this->mCharstringsPlaceHolderPosition = LVar6;
  CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
  CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0x11);
  if (((this->mOpenTypeInput).mCFF.mPrivateDicts)->mPrivateDictStart == 0) {
    this->mPrivatePlaceHolderPosition = 0;
  }
  else {
    LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
    this->mPrivatePlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
    CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
    CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0x12);
  }
  if (this->mIsCID == true) {
    this->mEncodingPlaceHolderPosition = 0;
    LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
    this->mFDArrayPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
    CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0xc24);
    LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
    this->mFDSelectPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
    CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0xc25);
  }
  else {
    LVar6 = OutputStringBufferStream::GetCurrentPosition(&topDictStream);
    this->mEncodingPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes(&dictPrimitiveWriter);
    CFFPrimitiveWriter::WriteDictOperator(&dictPrimitiveWriter,0x10);
    this->mFDArrayPlaceHolderPosition = 0;
    this->mFDSelectPlaceHolderPosition = 0;
  }
  EVar2 = CFFPrimitiveWriter::GetInternalState(&dictPrimitiveWriter);
  CFFPrimitiveWriter::~CFFPrimitiveWriter(&dictPrimitiveWriter);
  OutputStringBufferStream::~OutputStringBufferStream(&topDictStream);
  return EVar2;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::WriteTopDictSegment(MyStringBuf& ioTopDictSegment)
{
	OutputStringBufferStream topDictStream(&ioTopDictSegment);
	CFFPrimitiveWriter dictPrimitiveWriter;
	UShortToDictOperandListMap::iterator itROS;
	UShortToDictOperandListMap::iterator it;
	dictPrimitiveWriter.SetStream(&topDictStream);

	UShortToDictOperandListMap& originalTopDictRef = mOpenTypeInput.mCFF.mTopDictIndex[0].mTopDict;

	itROS = originalTopDictRef.find(scROS);

	 // make sure to write ROS first, if one exists
	if(mIsCID)
		dictPrimitiveWriter.WriteDictItems(itROS->first,itROS->second);

	// write all keys, excluding those that we want to write on our own
	for(it = originalTopDictRef.begin(); it != originalTopDictRef.end();++it)
	{
		if(	it->first != scROS &&
			it->first != scCharset &&
			it->first != scEncoding &&
			it->first != scCharstrings &&
			it->first != scPrivate &&
			it->first != scFDArray &&
			it->first != scFDSelect)
				dictPrimitiveWriter.WriteDictItems(it->first,it->second);
	}
	// check if it had an embedded postscript (which would normally be the FSType implementation).
	// if not...create one to implement the FSType
	if(originalTopDictRef.find(scEmbeddedPostscript) == originalTopDictRef.end() && mOpenTypeInput.mOS2Exists)
	{
		// no need for sophistication here...you can consider this as the only string to be added.
		// so can be sure that its index would be the current count 
		std::stringstream formatter;
		formatter<<"/FSType "<<mOpenTypeInput.mOS2.fsType<<" def";
		mOptionalEmbeddedPostscript = formatter.str();
		dictPrimitiveWriter.WriteIntegerOperand(mOpenTypeInput.mCFF.mStringsCount + N_STD_STRINGS);
		dictPrimitiveWriter.WriteDictOperator(scEmbeddedPostscript);
	}
	else
		mOptionalEmbeddedPostscript = "";

	// now leave placeholders, record their positions
	mCharsetPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharset);
	mCharstringsPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharstrings);
	if(mOpenTypeInput.mCFF.mPrivateDicts[0].mPrivateDictStart != 0)
	{
		mPrivatePlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes(); // for private it's two places - size and position
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scPrivate);
	}
	else
	{
		mPrivatePlaceHolderPosition = 0;
	}
	if(mIsCID)
	{
		mEncodingPlaceHolderPosition = 0;
		mFDArrayPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDArray);
		mFDSelectPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDSelect);
	}
	else
	{
		mEncodingPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scEncoding);
		mFDArrayPlaceHolderPosition = 0;
		mFDSelectPlaceHolderPosition = 0;
	}
	return dictPrimitiveWriter.GetInternalState();
}